

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::drawPoints
          (TransformFeedbackOverflowQueryFunctionalBase *this,GLsizei count)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  beginQueries(this);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x538))(0,0,count);
  endQueries(this);
  return;
}

Assistant:

void drawPoints(GLsizei count)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		beginQueries();
		gl.drawArrays(GL_POINTS, 0, count);
		endQueries();
	}